

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

ValueType * __thiscall
HighsHashTable<int,_std::pair<double,_int>_>::operator[]
          (HighsHashTable<int,_std::pair<double,_int>_> *this,KeyType_conflict *key)

{
  ulong uVar1;
  bool bVar2;
  pointer pHVar3;
  pair<double,_int> *ppVar4;
  type puVar5;
  ulong uVar6;
  HighsHashTableEntry<int,_std::pair<double,_int>_> *__a;
  u64 uVar7;
  HighsHashTable<int,_std::pair<double,_int>_> *in_RSI;
  HighsHashTable<int,_std::pair<double,_int>_> *in_RDI;
  u64 distanceOfCurrentOccupant;
  u64 currentDistance;
  Entry entry;
  ValueType *insertLocation;
  u8 meta;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  Entry *entryArray;
  int *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined8 local_60;
  double local_58;
  HighsHashTable<int,_std::pair<double,_int>_> *in_stack_ffffffffffffffb0;
  u64 *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  uchar in_stack_ffffffffffffffc7;
  HighsHashTable<int,_std::pair<double,_int>_> *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  HighsHashTable<int,_std::pair<double,_int>_> *in_stack_ffffffffffffffd8;
  pair<double,_int> *local_8;
  
  pHVar3 = std::
           unique_ptr<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
           ::get((unique_ptr<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                  *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  bVar2 = findPosition(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                       (u8 *)in_stack_ffffffffffffffc8,
                       (u64 *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8,(u64 *)in_stack_ffffffffffffffb0);
  if (bVar2) {
    local_8 = HighsHashTableEntry<int,_std::pair<double,_int>_>::value
                        (pHVar3 + (long)in_stack_ffffffffffffffd8);
  }
  else if ((in_RDI->numElements == (in_RDI->tableSizeMask + 1) * 7 >> 3) ||
          (in_stack_ffffffffffffffd8 == in_stack_ffffffffffffffc8)) {
    growTable(in_stack_ffffffffffffffb0);
    local_8 = operator[](in_RSI,&pHVar3->key_);
  }
  else {
    ppVar4 = HighsHashTableEntry<int,_std::pair<double,_int>_>::value
                       (pHVar3 + (long)in_stack_ffffffffffffffd8);
    HighsHashTableEntry<int,_std::pair<double,_int>_>::HighsHashTableEntry<const_int_&,_0>
              ((HighsHashTableEntry<int,_std::pair<double,_int>_> *)
               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    in_RDI->numElements = in_RDI->numElements + 1;
    do {
      puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          (size_t)in_stack_ffffffffffffff78);
      bVar2 = occupied(in_RDI,*puVar5);
      if (!bVar2) {
        puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffff80),
                            (size_t)in_stack_ffffffffffffff78);
        *puVar5 = in_stack_ffffffffffffffc7;
        pHVar3 = pHVar3 + (long)in_stack_ffffffffffffffd8;
        *(undefined8 *)pHVar3 = local_60;
        (pHVar3->value_).first = local_58;
        *(HighsHashTable<int,_std::pair<double,_int>_> **)&(pHVar3->value_).second =
             in_stack_ffffffffffffffb0;
        return ppVar4;
      }
      uVar6 = (long)in_stack_ffffffffffffffd8 - (long)in_stack_ffffffffffffffd0;
      uVar1 = in_RDI->tableSizeMask;
      __a = (HighsHashTableEntry<int,_std::pair<double,_int>_> *)
            distanceFromIdealSlot
                      ((HighsHashTable<int,_std::pair<double,_int>_> *)
                       CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       (u64)in_stack_ffffffffffffff78);
      if (__a < (HighsHashTableEntry<int,_std::pair<double,_int>_> *)(uVar6 & uVar1)) {
        std::swap<HighsHashTableEntry<int,std::pair<double,int>>>
                  (__a,(HighsHashTableEntry<int,_std::pair<double,_int>_> *)in_RDI);
        puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                            (size_t)in_stack_ffffffffffffff78);
        std::swap<unsigned_char>(&stack0xffffffffffffffc7,puVar5);
        in_stack_ffffffffffffff78 =
             (int *)((long)in_stack_ffffffffffffffd8 - (long)__a & in_RDI->tableSizeMask);
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffff78;
        uVar7 = maxDistance();
        in_stack_ffffffffffffffc8 =
             (HighsHashTable<int,_std::pair<double,_int>_> *)
             ((long)in_stack_ffffffffffffff78 + uVar7 & in_RDI->tableSizeMask);
      }
      in_stack_ffffffffffffffd8 =
           (HighsHashTable<int,_std::pair<double,_int>_> *)
           ((ulong)((long)&(in_stack_ffffffffffffffd8->entries)._M_t.
                           super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                           .
                           super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>
                           ._M_head_impl + 1U) & in_RDI->tableSizeMask);
    } while (in_stack_ffffffffffffffd8 != in_stack_ffffffffffffffc8);
    growTable(in_stack_ffffffffffffffb0);
    HighsHashTable<int,std::pair<double,int>>::
    insert<HighsHashTableEntry<int,std::pair<double,int>>>(in_RSI,pHVar3);
    local_8 = operator[](in_RSI,&pHVar3->key_);
  }
  return local_8;
}

Assistant:

ValueType& operator[](const KeyType& key) {
    Entry* entryArray = entries.get();
    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(key, meta, startPos, maxPos, pos))
      return entryArray[pos].value();

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return (*this)[key];
    }

    using std::swap;
    ValueType& insertLocation = entryArray[pos].value();
    Entry entry(key);
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return insertLocation;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return (*this)[key];
  }